

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O2

void __thiscall glu::Texture3D::upload(Texture3D *this)

{
  code *pcVar1;
  pointer pPVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TransferFormat TVar5;
  NotSupportedError *this_00;
  TestError *this_01;
  long lVar6;
  int levelNdx;
  ulong uVar7;
  long lVar8;
  allocator<char> local_61;
  long local_60;
  ConstPixelBufferAccess access;
  
  iVar3 = (*this->m_context->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  local_60 = lVar6;
  if (*(long *)(lVar6 + 0x1320) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&access,"glTexImage3D() is not supported",&local_61);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)&access);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_glTexture != 0) {
    (**(code **)(lVar6 + 0xb8))(0x806f);
    pcVar1 = *(code **)(lVar6 + 0xff0);
    iVar3 = computePixelStore((TextureFormat *)&this->m_refTexture);
    (*pcVar1)(0xcf5,iVar3);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    checkError(dVar4,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x2cf);
    TVar5 = getTransferFormat((this->m_refTexture).super_TextureLevelPyramid.m_format);
    lVar6 = 8;
    lVar8 = 0;
    uVar7 = 0;
    while( true ) {
      pPVar2 = (this->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(int)(((long)(this->m_refTexture).super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x28) <=
          (long)uVar7) break;
      if (*(long *)((long)&((this->m_refTexture).super_TextureLevelPyramid.m_data.
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar6) != 0) {
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&access,(ConstPixelBufferAccess *)
                           ((long)(pPVar2->super_ConstPixelBufferAccess).m_size.m_data + lVar8 + -8)
                  );
        (**(code **)(local_60 + 0x1320))
                  (0x806f,uVar7 & 0xffffffff,this->m_format,access.m_size.m_data[0],
                   access.m_size.m_data[1],access.m_size.m_data[2],0,TVar5,(ulong)TVar5 >> 0x20,
                   access.m_data);
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x28;
      lVar6 = lVar6 + 0x10;
    }
    dVar4 = (**(code **)(local_60 + 0x800))();
    checkError(dVar4,"Texture upload failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x2de);
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"m_glTexture",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x2cc);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Texture3D::upload (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	DE_ASSERT(!m_isCompressed);

	if (!gl.texImage3D)
		throw tcu::NotSupportedError("glTexImage3D() is not supported");

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_3D, m_glTexture);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(m_refTexture.getFormat()));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");

	TransferFormat transferFormat = getTransferFormat(m_refTexture.getFormat());

	for (int levelNdx = 0; levelNdx < m_refTexture.getNumLevels(); levelNdx++)
	{
		if (m_refTexture.isLevelEmpty(levelNdx))
			continue; // Don't upload.

		tcu::ConstPixelBufferAccess access = m_refTexture.getLevel(levelNdx);
		DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*access.getWidth());
		DE_ASSERT(access.getSlicePitch() == access.getFormat().getPixelSize()*access.getWidth()*access.getHeight());
		gl.texImage3D(GL_TEXTURE_3D, levelNdx, m_format, access.getWidth(), access.getHeight(), access.getDepth(), 0 /* border */, transferFormat.format, transferFormat.dataType, access.getDataPtr());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}